

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-raw-skt.c
# Opt level: O0

int rops_handle_POLLIN_raw_skt(lws_context_per_thread *pt,lws *wsi,pollfd *pollfd)

{
  int iVar1;
  size_t sVar2;
  lws *plVar3;
  ushort local_42;
  int local_40;
  int iStack_3c;
  uint16_t u16;
  int buffered;
  int n;
  lws_tokens ebuf;
  pollfd *pollfd_local;
  lws *wsi_local;
  lws_context_per_thread *pt_local;
  
  ebuf._8_8_ = pollfd;
  iVar1 = lws_has_buffered_out(wsi);
  if (iVar1 != 0) {
    if ((*(ushort *)(ebuf._8_8_ + 6) & 4) == 0) {
      return 5;
    }
    iVar1 = lws_issue_raw(wsi,(uchar *)0x0,0);
    if (-1 < iVar1) {
      return 5;
    }
    goto LAB_0013103d;
  }
  if (((wsi->wsistate & 0x10000000) == 0) && ((wsi->wsistate & 0xffff) != 0x119)) {
    _lws_log(0x10,"%s: %p: wsistate 0x%x\n","rops_handle_POLLIN_raw_skt",wsi,(ulong)wsi->wsistate);
    if (((wsi->wsistate & 0xffff) != 0x208) &&
       (iVar1 = lws_server_socket_service_ssl(wsi,-1), iVar1 != 0)) {
      return 6;
    }
    return 5;
  }
  if (((((*(ushort *)(ebuf._8_8_ + 6) & *(ushort *)(ebuf._8_8_ + 4) & 1) == 0) ||
       ((wsi->wsistate & 0xffff) == 0x209)) || ((wsi->wsistate & 0xffff) == 0x202)) ||
     (((*(ulong *)&wsi->field_0x2dc >> 0x13 & 1) != 0 &&
      ((*(ushort *)(ebuf._8_8_ + 6) & *(ushort *)(ebuf._8_8_ + 4) & 4) != 0)))) {
    if (((*(ulong *)&wsi->field_0x2dc >> 0x13 & 1) != 0) &&
       ((*(ushort *)(ebuf._8_8_ + 6) & *(ushort *)(ebuf._8_8_ + 4) & 4) != 0)) {
      *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffffffff7ffff;
    }
  }
  else {
    _buffered = (uchar *)0x0;
    ebuf.token._0_4_ = 0;
    local_40 = lws_buflist_aware_read
                         (pt,wsi,(lws_tokens *)&buffered,'\x01',"rops_handle_POLLIN_raw_skt");
    if ((int)ebuf.token != -4) {
      if ((int)ebuf.token == -1) goto LAB_0013103d;
      if ((int)ebuf.token == 0) {
        _lws_log(8,"%s: read 0 len\n","rops_handle_POLLIN_raw_skt");
        *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffbfffffff | 0x40000000;
        lws_change_pollfd(wsi,1,0);
        goto LAB_0013103d;
      }
      if (((wsi->context->udp_loss_sim_rx_pc == '\0') ||
          (sVar2 = lws_get_random(wsi->context,&local_42,2), sVar2 != 2)) ||
         ((uint)wsi->context->udp_loss_sim_rx_pc < ((uint)local_42 * 100) / 0xffff)) {
        iStack_3c = user_callback_handle_rxflow
                              (wsi->protocol->callback,wsi,LWS_CALLBACK_RAW_RX,wsi->user_space,
                               _buffered,(long)(int)ebuf.token);
      }
      else {
        _lws_log(2,"%s: dropping udp rx\n","rops_handle_POLLIN_raw_skt");
        iStack_3c = (int)ebuf.token;
      }
      if (iStack_3c < 0) {
        _lws_log(8,"LWS_CALLBACK_RAW_RX_fail\n");
        goto LAB_0013103d;
      }
      iVar1 = lws_buflist_aware_finished_consuming
                        (wsi,(lws_tokens *)&buffered,(int)ebuf.token,local_40,
                         "rops_handle_POLLIN_raw_skt");
      if (iVar1 != 0) {
        return 6;
      }
    }
  }
  if ((*(ushort *)(ebuf._8_8_ + 6) & 4) == 0) {
    return 5;
  }
  if (((wsi->wsistate & 0xffff) == 0x202) &&
     (plVar3 = lws_client_connect_3_connect(wsi,(char *)0x0,(addrinfo *)0x0,0,(void *)0x0),
     plVar3 == (lws *)0x0)) {
    return 4;
  }
  iVar1 = lws_change_pollfd(wsi,4,0);
  if (iVar1 == 0) {
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffbffffffffff;
    lws_stats_bump(pt,8,1);
    iStack_3c = user_callback_handle_rxflow
                          (wsi->protocol->callback,wsi,LWS_CALLBACK_RAW_WRITEABLE,wsi->user_space,
                           (void *)0x0,0);
    if (-1 < iStack_3c) {
      return 5;
    }
    _lws_log(8,"writeable_fail\n");
  }
  else {
    _lws_log(4,"%s a\n","rops_handle_POLLIN_raw_skt");
  }
LAB_0013103d:
  lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"raw svc fail");
  return 4;
}

Assistant:

static int
rops_handle_POLLIN_raw_skt(struct lws_context_per_thread *pt, struct lws *wsi,
			   struct lws_pollfd *pollfd)
{
	struct lws_tokens ebuf;
	int n, buffered;

	/* pending truncated sends have uber priority */

	if (lws_has_buffered_out(wsi)) {
		if (!(pollfd->revents & LWS_POLLOUT))
			return LWS_HPI_RET_HANDLED;

		/* drain the output buflist */
		if (lws_issue_raw(wsi, NULL, 0) < 0)
			goto fail;
		/*
		 * we can't afford to allow input processing to send
		 * something new, so spin around he event loop until
		 * he doesn't have any partials
		 */
		return LWS_HPI_RET_HANDLED;
	}


#if defined(LWS_WITH_SERVER)
	if (!lwsi_role_client(wsi) &&  lwsi_state(wsi) != LRS_ESTABLISHED) {

		lwsl_debug("%s: %p: wsistate 0x%x\n", __func__, wsi,
			   (int)wsi->wsistate);

		if (lwsi_state(wsi) != LRS_SSL_INIT)
			if (lws_server_socket_service_ssl(wsi,
							  LWS_SOCK_INVALID))
				return LWS_HPI_RET_PLEASE_CLOSE_ME;

		return LWS_HPI_RET_HANDLED;
	}
#endif

	if ((pollfd->revents & pollfd->events & LWS_POLLIN) &&
	    /* any tunnel has to have been established... */
	    lwsi_state(wsi) != LRS_SSL_ACK_PENDING &&
	    /* we are actually connected */
	    lwsi_state(wsi) != LRS_WAITING_CONNECT &&
	    !(wsi->favoured_pollin &&
	      (pollfd->revents & pollfd->events & LWS_POLLOUT))) {

		ebuf.token = NULL;
		ebuf.len = 0;

		buffered = lws_buflist_aware_read(pt, wsi, &ebuf, 1, __func__);
		switch (ebuf.len) {
		case 0:
			lwsl_info("%s: read 0 len\n", __func__);
			wsi->seen_zero_length_recv = 1;
			if (lws_change_pollfd(wsi, LWS_POLLIN, 0))
				goto fail;

			/*
			 * we need to go to fail here, since it's the only
			 * chance we get to understand that the socket has
			 * closed
			 */
			// goto try_pollout;
			goto fail;

		case LWS_SSL_CAPABLE_ERROR:
			goto fail;
		case LWS_SSL_CAPABLE_MORE_SERVICE:
			goto try_pollout;
		}

#if defined(LWS_WITH_UDP)
		if (wsi->context->udp_loss_sim_rx_pc) {
			uint16_t u16;
			/*
			 * We should randomly drop some of these
			 */

			if (lws_get_random(wsi->context, &u16, 2) == 2 &&
			    ((u16 * 100) / 0xffff) <=
				    wsi->context->udp_loss_sim_rx_pc) {
				lwsl_warn("%s: dropping udp rx\n", __func__);
				/* pretend it was handled */
				n = ebuf.len;
				goto post_rx;
			}
		}
#endif

		n = user_callback_handle_rxflow(wsi->protocol->callback,
						wsi, LWS_CALLBACK_RAW_RX,
						wsi->user_space, ebuf.token,
						ebuf.len);
#if defined(LWS_WITH_UDP)
post_rx:
#endif
		if (n < 0) {
			lwsl_info("LWS_CALLBACK_RAW_RX_fail\n");
			goto fail;
		}

		if (lws_buflist_aware_finished_consuming(wsi, &ebuf, ebuf.len,
							 buffered, __func__))
			return LWS_HPI_RET_PLEASE_CLOSE_ME;
	} else
		if (wsi->favoured_pollin &&
		    (pollfd->revents & pollfd->events & LWS_POLLOUT))
			/* we balanced the last favouring of pollin */
			wsi->favoured_pollin = 0;

try_pollout:

	if (!(pollfd->revents & LWS_POLLOUT))
		return LWS_HPI_RET_HANDLED;

#if defined(LWS_WITH_CLIENT)
	if (lwsi_state(wsi) == LRS_WAITING_CONNECT &&
	    !lws_client_connect_3_connect(wsi, NULL, NULL, 0, NULL))
		return LWS_HPI_RET_WSI_ALREADY_DIED;
#endif

	/* one shot */
	if (lws_change_pollfd(wsi, LWS_POLLOUT, 0)) {
		lwsl_notice("%s a\n", __func__);
		goto fail;
	}

	/* clear back-to-back write detection */
	wsi->could_have_pending = 0;

	lws_stats_bump(pt, LWSSTATS_C_WRITEABLE_CB, 1);
#if defined(LWS_WITH_STATS)
	if (wsi->active_writable_req_us) {
		uint64_t ul = lws_now_usecs() -
				wsi->active_writable_req_us;

		lws_stats_bump(pt, LWSSTATS_US_WRITABLE_DELAY_AVG, ul);
		lws_stats_max(pt,
			  LWSSTATS_US_WORST_WRITABLE_DELAY, ul);
		wsi->active_writable_req_us = 0;
	}
#endif
	n = user_callback_handle_rxflow(wsi->protocol->callback,
			wsi, LWS_CALLBACK_RAW_WRITEABLE,
			wsi->user_space, NULL, 0);
	if (n < 0) {
		lwsl_info("writeable_fail\n");
		goto fail;
	}

	return LWS_HPI_RET_HANDLED;

fail:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "raw svc fail");

	return LWS_HPI_RET_WSI_ALREADY_DIED;
}